

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::Matchers::StdString::StartsWithMatcher::match(StartsWithMatcher *this,string *source)

{
  bool bVar1;
  string local_38;
  string *local_18;
  string *source_local;
  StartsWithMatcher *this_local;
  
  local_18 = source;
  source_local = (string *)this;
  CasedString::adjustString(&local_38,&(this->super_StringMatcherBase).m_comparator,source);
  bVar1 = startsWith(&local_38,&(this->super_StringMatcherBase).m_comparator.m_str);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool StartsWithMatcher::match(std::string const &source) const {
        return startsWith(m_comparator.adjustString(source), m_comparator.m_str);
      }